

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# species.cpp
# Opt level: O1

ostream * IO::operator<<(ostream *output,Species *species)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,"(\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(output,"    Species: \n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(output,"    (\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(output,"        Name      : \"",0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(species->name_)._M_dataplus._M_p,(species->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
  for (p_Var2 = (species->speciesComposition_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(species->speciesComposition_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"        Element : ",0x12);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," | Number : ",0xc);
    poVar1 = std::ostream::_M_insert<double>(*(double *)(p_Var2 + 2));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"        Mol. Mass : ",0x14);
  poVar1 = std::ostream::_M_insert<double>(species->molecularWeight_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    )\n",6);
  poVar1 = operator<<(poVar1,&species->transport_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = operator<<(poVar1,&species->thermo_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Species& species)
    {
        map<string,double>::const_iterator iter;

        output << "(\n"
               << "    Species: \n"
               << "    (\n"
               << "        Name      : \"" << species.name_ << "\"\n";
        for (iter = species.speciesComposition_.begin(); iter != species.speciesComposition_.end(); ++iter)
                {
        output << "        Element : " << iter->first << " | Number : " << iter->second << "\n";
        }
        output << "        Mol. Mass : " << species.molecularWeight_ << "\n"
               << "    )\n"
               << species.transport_ << "\n"
               << species.thermo_ << "\n"
               << ")";
        return output;
    }